

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::writeEncryptionDictionary(QPDFWriter *this)

{
  _Base_ptr p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  element_type *peVar4;
  element_type *__n;
  
  iVar2 = openObject(this,((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->encryption_dict_objid);
  __n = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __n->encryption_dict_objid = iVar2;
  ::qpdf::pl::Count::write(__n->pipeline,0x27ea24,(void *)0x2,(size_t)__n);
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = *(_Base_ptr *)
            ((long)&(peVar4->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header + 0x10);
  p_Var1 = &(peVar4->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != p_Var1) {
    do {
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27ec86,(void *)0x1,(size_t)__n);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)*(undefined8 *)(p_Var3 + 1),p_Var3[1]._M_parent,(size_t)__n)
      ;
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27ec86,(void *)0x1,(size_t)__n);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent,(size_t)__n)
      ;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != p_Var1);
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  ::qpdf::pl::Count::write(peVar4->pipeline,0x27ee86,(void *)0x3,(size_t)__n);
  closeObject(this,((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->encryption_dict_objid);
  return;
}

Assistant:

void
QPDFWriter::writeEncryptionDictionary()
{
    m->encryption_dict_objid = openObject(m->encryption_dict_objid);
    writeString("<<");
    for (auto const& iter: m->encryption_dictionary) {
        writeString(" ");
        writeString(iter.first);
        writeString(" ");
        writeString(iter.second);
    }
    writeString(" >>");
    closeObject(m->encryption_dict_objid);
}